

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall
clickhouse::ColumnVector<absl::int128>::ColumnVector
          (ColumnVector<absl::int128> *this,
          vector<absl::int128,_std::allocator<absl::int128>_> *data)

{
  TypeRef TStack_28;
  
  Type::CreateSimple<absl::int128>();
  Column::Column(&this->super_Column,&TStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&TStack_28.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnVector_00186608;
  std::vector<absl::int128,_std::allocator<absl::int128>_>::vector(&this->data_,data);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector(const std::vector<T>& data)
    : Column(Type::CreateSimple<T>())
    , data_(data)
{
}